

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QString * maybeEncodeTag(QString *__return_storage_ptr__,QCborContainerPrivate *d)

{
  Element *idx;
  long lVar1;
  ulong uVar2;
  QString *pQVar3;
  char *pcVar4;
  long *plVar5;
  long in_FS_OFFSET;
  QByteArrayView bytes;
  QUuid local_20;
  QString *local_10;
  
  local_10 = *(QString **)(in_FS_OFFSET + 0x28);
  idx = (d->elements).d.ptr;
  lVar1 = (idx->field_0).value;
  if (lVar1 < 0x20) {
    if (lVar1 - 0x15U < 3) {
      if (idx[1].type == ByteArray) {
        if (*(QString **)(in_FS_OFFSET + 0x28) == local_10) {
          pQVar3 = encodeByteArray(__return_storage_ptr__,(QCborContainerPrivate *)(d->data).d.ptr,
                                   (qsizetype)idx,1);
          return pQVar3;
        }
        goto LAB_002ee801;
      }
    }
    else if (lVar1 == 0) {
LAB_002ee729:
      if (idx[1].type == String) {
        if (*(QString **)(in_FS_OFFSET + 0x28) == local_10) {
          pQVar3 = makeString(__return_storage_ptr__,d,1,FromRaw);
          return pQVar3;
        }
        goto LAB_002ee801;
      }
    }
  }
  else if (lVar1 == 0x25) {
    uVar2._0_4_ = idx[1].type;
    uVar2._4_4_ = idx[1].flags;
    pcVar4 = (d->data).d.ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = &QByteArray::_empty;
    }
    if (((uVar2 & 0x2ffffffff) == 0x200000040) &&
       (plVar5 = (long *)((ulong)(pcVar4 + idx[1].field_0.value) & (long)(uVar2 << 0x1e) >> 0x3f),
       *plVar5 == 0x10)) {
      bytes.m_size = plVar5 + 1;
      bytes.m_data = (storage_type *)idx;
      local_20 = QUuid::fromRfc4122((QUuid *)0x10,bytes);
      QUuid::toString(__return_storage_ptr__,&local_20,WithoutBraces);
      if (*(QString **)(in_FS_OFFSET + 0x28) == local_10) {
        return *(QString **)(in_FS_OFFSET + 0x28);
      }
      goto LAB_002ee801;
    }
  }
  else if (lVar1 == 0x20) goto LAB_002ee729;
  pQVar3 = *(QString **)(in_FS_OFFSET + 0x28);
  if (pQVar3 == local_10) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return pQVar3;
  }
LAB_002ee801:
  __stack_chk_fail();
}

Assistant:

static QString maybeEncodeTag(const QCborContainerPrivate *d)
{
    qint64 tag = d->elements.at(0).value;
    const Element &e = d->elements.at(1);

    switch (tag) {
    case qint64(QCborKnownTags::DateTimeString):
    case qint64(QCborKnownTags::Url):
        if (e.type == QCborValue::String)
            return makeString(d, 1);
        break;

    case qint64(QCborKnownTags::ExpectedBase64url):
    case qint64(QCborKnownTags::ExpectedBase64):
    case qint64(QCborKnownTags::ExpectedBase16):
        if (e.type == QCborValue::ByteArray)
            return encodeByteArray(d, 1, QCborTag(tag));
        break;

    case qint64(QCborKnownTags::Uuid):
#ifndef QT_BOOTSTRAPPED
        if (const ByteData *b = d->byteData(e); e.type == QCborValue::ByteArray && b
                && b->len == sizeof(QUuid))
            return QUuid::fromRfc4122(b->asByteArrayView()).toString(QUuid::WithoutBraces);
#endif
        break;
    }

    // don't know what to do, bail out
    return QString();
}